

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O0

void node::
     index_tree<node::TreeIndexAPTED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
               (TreeIndexAPTED *ti,Node<label::StringLabel> *n,
               LabelDictionary<label::StringLabel> *ld,UnitCostModelLD<label::StringLabel> *cm)

{
  iterator iVar1;
  _Bit_iterator __first;
  _Bit_iterator __first_00;
  _Bit_iterator __last;
  _Bit_iterator __last_00;
  int local_178 [2];
  int height;
  int subtree_max_depth;
  int start_height;
  int start_depth;
  int start_postorder;
  int start_preorder;
  double *local_158;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_150;
  double local_148;
  double *local_140;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_138;
  int local_12c;
  longlong *local_128;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_120;
  int local_114;
  longlong *local_110;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_108;
  int local_fc;
  longlong *local_f8;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_f0;
  bool local_e1;
  _Bit_type *local_e0;
  uint local_d8;
  _Bit_type *local_d0;
  uint local_c8;
  _Bit_type *local_c0;
  uint local_b8;
  _Bit_type *local_b0;
  uint local_a8;
  bool local_99;
  _Bit_type *local_98;
  uint local_90;
  _Bit_type *local_88;
  uint local_80;
  _Bit_type *local_78;
  uint local_70;
  _Bit_type *local_68;
  uint local_60;
  int local_54;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  int local_3c;
  UnitCostModelLD<label::StringLabel> *pUStack_38;
  int tree_size;
  UnitCostModelLD<label::StringLabel> *cm_local;
  LabelDictionary<label::StringLabel> *ld_local;
  Node<label::StringLabel> *n_local;
  TreeIndexAPTED *ti_local;
  
  pUStack_38 = cm;
  cm_local = (UnitCostModelLD<label::StringLabel> *)ld;
  ld_local = (LabelDictionary<label::StringLabel> *)n;
  n_local = (Node<label::StringLabel> *)ti;
  local_3c = Node<label::StringLabel>::get_tree_size(n);
  *(int *)&(n_local->children_).
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_start = local_3c;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&n_local[1].label_.label_._M_string_length,
             (long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(n_local + 2),(long)local_3c);
  local_48._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)(n_local + 2));
  local_50 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)(n_local + 2));
  local_54 = -1;
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (local_48,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_50,
             &local_54);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &n_local[8].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&n_local[7].label_.label_.field_2,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)((long)&n_local[6].label_.label_.field_2 + 8),
             (long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &n_local[7].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&n_local[8].label_.label_._M_string_length,
             (long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(n_local + 9),(long)local_3c);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&n_local[2].label_,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &(n_local->children_).
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(n_local->label_).label_.field_2,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &n_local[1].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)((long)&n_local[2].label_.label_.field_2 + 8),
             (long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&n_local[3].label_.label_.field_2,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &n_local[4].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             &n_local[3].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&n_local[4].label_.label_._M_string_length,
             (long)local_3c);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(n_local + 5),(long)local_3c);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)&n_local[5].label_,(long)local_3c,false);
  iVar1 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)&n_local[5].label_);
  local_78 = iVar1.super__Bit_iterator_base._M_p;
  local_70 = iVar1.super__Bit_iterator_base._M_offset;
  local_68 = local_78;
  local_60 = local_70;
  iVar1 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)&n_local[5].label_);
  local_98 = iVar1.super__Bit_iterator_base._M_p;
  local_90 = iVar1.super__Bit_iterator_base._M_offset;
  local_99 = false;
  __first.super__Bit_iterator_base._M_offset = local_60;
  __first.super__Bit_iterator_base._M_p = local_68;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar1.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar1.super__Bit_iterator_base._0_12_,8);
  local_88 = local_98;
  local_80 = local_90;
  std::fill<std::_Bit_iterator,bool>(__first,__last,&local_99);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)
             &n_local[6].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(long)local_3c,false);
  iVar1 = std::vector<bool,_std::allocator<bool>_>::begin
                    ((vector<bool,_std::allocator<bool>_> *)
                     &n_local[6].children_.
                      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  local_c0 = iVar1.super__Bit_iterator_base._M_p;
  local_b8 = iVar1.super__Bit_iterator_base._M_offset;
  local_b0 = local_c0;
  local_a8 = local_b8;
  iVar1 = std::vector<bool,_std::allocator<bool>_>::end
                    ((vector<bool,_std::allocator<bool>_> *)
                     &n_local[6].children_.
                      super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  local_e0 = iVar1.super__Bit_iterator_base._M_p;
  local_d8 = iVar1.super__Bit_iterator_base._M_offset;
  local_e1 = false;
  __first_00.super__Bit_iterator_base._M_offset = local_a8;
  __first_00.super__Bit_iterator_base._M_p = local_b0;
  __first_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._12_4_ = 0;
  __last_00.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar1.super__Bit_iterator_base._0_12_,0);
  __last_00.super__Bit_iterator_base._M_offset = SUB124(iVar1.super__Bit_iterator_base._0_12_,8);
  local_d0 = local_e0;
  local_c8 = local_d8;
  std::fill<std::_Bit_iterator,bool>(__first_00,__last_00,&local_e1);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)&n_local[9].label_,(long)local_3c);
  local_f0._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)&n_local[9].label_);
  local_f8 = (longlong *)
             std::vector<long_long,_std::allocator<long_long>_>::end
                       ((vector<long_long,_std::allocator<long_long>_> *)&n_local[9].label_);
  local_fc = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
            (local_f0,(__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                       )local_f8,&local_fc);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             ((long)&n_local[9].label_.label_.field_2 + 8),(long)local_3c);
  local_108._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)
                  ((long)&n_local[9].label_.label_.field_2 + 8));
  local_110 = (longlong *)
              std::vector<long_long,_std::allocator<long_long>_>::end
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         ((long)&n_local[9].label_.label_.field_2 + 8));
  local_114 = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
            (local_108,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_110,&local_114);
  std::vector<long_long,_std::allocator<long_long>_>::resize
            ((vector<long_long,_std::allocator<long_long>_> *)
             &n_local[10].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_3c);
  local_120._M_current =
       (longlong *)
       std::vector<long_long,_std::allocator<long_long>_>::begin
                 ((vector<long_long,_std::allocator<long_long>_> *)
                  &n_local[10].children_.
                   super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_128 = (longlong *)
              std::vector<long_long,_std::allocator<long_long>_>::end
                        ((vector<long_long,_std::allocator<long_long>_> *)
                         &n_local[10].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_12c = 0;
  std::
  fill<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,int>
            (local_120,
             (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>)
             local_128,&local_12c);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)&n_local[10].label_.label_.field_2,
             (long)local_3c);
  local_138._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)&n_local[10].label_.label_.field_2);
  local_140 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[10].label_.label_.field_2);
  local_148 = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_138,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_140,
             &local_148);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             &n_local[0xb].children_.
              super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,(long)local_3c);
  local_150._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin
                 ((vector<double,_std::allocator<double>_> *)
                  &n_local[0xb].children_.
                   super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  local_158 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)
                         &n_local[0xb].children_.
                          super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  _start_postorder = 0.0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
            (local_150,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)local_158,
             (double *)&start_postorder);
  start_depth = 0;
  start_height = 0;
  subtree_max_depth = 0;
  height = 0;
  local_178[1] = 0;
  local_178[0] = 0;
  index_tree_recursion<node::TreeIndexAPTED,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
            ((TreeIndexAPTED *)n_local,(Node<label::StringLabel> *)ld_local,
             (LabelDictionary<label::StringLabel> *)cm_local,pUStack_38,&start_depth,&start_height,0
             ,local_178 + 1,0,local_178,-1,false);
  fill_ln((vector<int,_std::allocator<int>_> *)&n_local[4].label_.label_._M_string_length,
          (vector<int,_std::allocator<int>_> *)(n_local + 5),
          (vector<int,_std::allocator<int>_> *)&n_local[1].label_.label_._M_string_length,
          (vector<int,_std::allocator<int>_> *)
          &n_local[7].children_.
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  fill_rld((vector<int,_std::allocator<int>_> *)
           &n_local[3].children_.
            super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,
           (vector<int,_std::allocator<int>_> *)&n_local[1].label_.label_._M_string_length,
           (vector<int,_std::allocator<int>_> *)(n_local + 9),
           (vector<int,_std::allocator<int>_> *)&n_local[8].label_.label_._M_string_length,
           (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&n_local[2].label_);
  return;
}

Assistant:

void index_tree(TreeIndex& ti, const node::Node<Label>& n,
    label::LabelDictionary<Label>& ld, const CostModel& cm) {
  
  int tree_size = n.get_tree_size();
  ti.tree_size_ = tree_size;
  
  // Resize and clear the indexes.
  // TODO: Resizing is not enough for some vectors in case the same TreeIndex
  //       object is used for multiple trees. Old incorrect values may remain
  //       in the vectors.
  if constexpr (std::is_base_of<PostLToSize, TreeIndex>::value) {
    ti.postl_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToSize, TreeIndex>::value) {
    ti.prel_to_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToParent, TreeIndex>::value) {
    ti.postl_to_parent_.resize(tree_size);
    std::fill(ti.postl_to_parent_.begin(), ti.postl_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PreLToParent, TreeIndex>::value) {
    ti.prel_to_parent_.resize(tree_size);
    std::fill(ti.prel_to_parent_.begin(), ti.prel_to_parent_.end(), -1);
  }
  if constexpr (std::is_base_of<PostLToPreL, TreeIndex>::value) {
    ti.postl_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostL, TreeIndex>::value) {
    ti.prel_to_postl_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPreR, TreeIndex>::value) {
    ti.prel_to_prer_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreRToPreL, TreeIndex>::value) {
    ti.prer_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToPostR, TreeIndex>::value) {
    ti.prel_to_postr_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToPreL, TreeIndex>::value) {
    ti.postr_to_prel_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToChildren, TreeIndex>::value) {
    ti.postl_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToChildren, TreeIndex>::value) {
    ti.prel_to_children_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLabelId, TreeIndex>::value) {
    ti.prel_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLabelId, TreeIndex>::value) {
    ti.postl_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToType, TreeIndex>::value) {
    ti.postl_to_type_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToLabelId, TreeIndex>::value) {
    ti.postr_to_label_id_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLLD, TreeIndex>::value) {
    ti.postl_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToLLD, TreeIndex>::value) {
    ti.prel_to_lld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToRLD, TreeIndex>::value) {
    ti.prel_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    ti.postr_to_rld_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToDepth, TreeIndex>::value) {
    ti.postl_to_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLCh, TreeIndex>::value) {
    ti.postl_to_lch_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToSubtreeMaxDepth, TreeIndex>::value) {
    ti.postl_to_subtree_max_depth_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    ti.postl_to_kr_ancestor_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    ti.prel_to_ln_.resize(tree_size);
    ti.prer_to_ln_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PreLToTypeLeft, TreeIndex>::value) {
    ti.prel_to_type_left_.resize(tree_size);
    std::fill(ti.prel_to_type_left_.begin(), ti.prel_to_type_left_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToTypeRight, TreeIndex>::value) {
    ti.prel_to_type_right_.resize(tree_size);
    std::fill(ti.prel_to_type_right_.begin(), ti.prel_to_type_right_.end(), false);
  }
  if constexpr (std::is_base_of<PreLToSpfCost, TreeIndex>::value) {
    ti.prel_to_cost_all_.resize(tree_size);
    std::fill(ti.prel_to_cost_all_.begin(), ti.prel_to_cost_all_.end(), 0);
    ti.prel_to_cost_left_.resize(tree_size);
    std::fill(ti.prel_to_cost_left_.begin(), ti.prel_to_cost_left_.end(), 0);
    ti.prel_to_cost_right_.resize(tree_size);
    std::fill(ti.prel_to_cost_right_.begin(), ti.prel_to_cost_right_.end(), 0);
  }
  if constexpr (std::is_base_of<PreLToSubtreeCost, TreeIndex>::value) {
    ti.prel_to_subtree_del_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_del_cost_.begin(), ti.prel_to_subtree_del_cost_.end(), 0.0);
    ti.prel_to_subtree_ins_cost_.resize(tree_size);
    std::fill(ti.prel_to_subtree_ins_cost_.begin(), ti.prel_to_subtree_ins_cost_.end(), 0.0);
  }
  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    ti.list_kr_.clear();
  }
  if constexpr (std::is_base_of<InvertedListDepthToPostL, TreeIndex>::value) {
    ti.inverted_list_depth_to_postl_.clear();
  }
  if constexpr (std::is_base_of<InvertedListLabelIdToPostL, TreeIndex>::value) {
    ti.inverted_list_label_id_to_postl_.clear();
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavChild, TreeIndex>::value) {
    ti.postl_to_left_fav_child_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToHeight, TreeIndex>::value) {
    ti.postl_to_height_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToOrderedChildSize, TreeIndex>::value) {
    ti.postl_to_ordered_child_size_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    ti.postl_to_favorder_.resize(tree_size);
  }
  if constexpr (std::is_base_of<PostLToLeftSibling, TreeIndex>::value) {
    ti.postl_to_left_sibling_.resize(tree_size);
  }

  // Orders start with '0'. Are modified by the recursive traversal.
  int start_preorder = 0;
  int start_postorder = 0;
  int start_depth = 0;
  int start_height = 0;

  // Maximum input tree depth - the first reference passed to recursion.
  int subtree_max_depth = 0;
  // Initial height.
  int height = 0;
  index_tree_recursion(ti, n, ld, cm, start_preorder, start_postorder,
      start_depth, subtree_max_depth, start_height, height, -1, false);
  
  if constexpr (std::is_base_of<PostLToFavorableChildOrder, TreeIndex>::value) {
    // Compute favorable child order.
    int ts = tree_size - 1;
    int fid = 0;
    fav_child_processing_order(ti, ts, fid);
  }

  if constexpr (std::is_base_of<ListKR, TreeIndex>::value) {
    // Add root to kr - not added in the recursion.
    ti.list_kr_.push_back(start_postorder-1);
  }

  if constexpr (std::is_base_of<PostLToKRAncestor, TreeIndex>::value) {
    fill_kr_ancestors(ti.postl_to_kr_ancestor_, ti.postl_to_lch_, ti.list_kr_);
  }

  if constexpr (std::is_base_of<PreToLn, TreeIndex>::value) {
    fill_ln(ti.prel_to_ln_, ti.prer_to_ln_, ti.prel_to_size_, ti.prer_to_prel_);
  }

  if constexpr (std::is_base_of<PostRToRLD, TreeIndex>::value) {
    fill_rld(ti.postr_to_rld_, ti.prel_to_size_, ti.postr_to_prel_,
        ti.prel_to_postr_, ti.prel_to_children_);
  }
}